

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O2

string * __thiscall Pl_SHA2::getRawDigest_abi_cxx11_(string *__return_storage_ptr__,Pl_SHA2 *this)

{
  logic_error *this_00;
  
  if (this->in_progress != true) {
    (*((this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_QPDFCryptoImpl[10])();
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"digest requested for in-progress SHA2 Pipeline");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string
Pl_SHA2::getRawDigest()
{
    if (this->in_progress) {
        throw std::logic_error("digest requested for in-progress SHA2 Pipeline");
    }
    return this->crypto->SHA2_digest();
}